

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::U64>
          (BinBinaryReader *this,U64 *value)

{
  char **ppcVar1;
  ulong *pos;
  ulong *puVar2;
  bool bVar3;
  ulong uVar4;
  
  pos = (ulong *)(this->reader).cur_;
  puVar2 = (ulong *)(this->reader).cap_;
  if (puVar2 < pos + 1) {
    bVar3 = fail_msg(this,"reader.read(value.value)",(char *)pos);
    uVar4 = (ulong)bVar3;
  }
  else {
    uVar4 = *pos;
    value->value = uVar4;
    ppcVar1 = &(this->reader).cur_;
    *ppcVar1 = *ppcVar1 + 8;
  }
  return (bool)(pos + 1 <= puVar2 | (byte)uVar4 & 1);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }